

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O0

void __thiscall
asmjit::v1_14::RAAssignment::assign
          (RAAssignment *this,RegGroup group,uint32_t workId,uint32_t physId,bool dirty)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint **ppuVar4;
  uint32_t *puVar5;
  uint in_ECX;
  uint in_EDX;
  uint uVar6;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  RAAssignment *in_RDI;
  byte in_R8B;
  undefined7 in_register_00000081;
  size_t in_R9;
  RegMask regMask;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  uint32_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffbc;
  uint local_2c;
  uint local_28;
  EVP_PKEY_CTX local_21 [9];
  uint *local_18;
  byte local_9;
  uint *local_8;
  
  bVar1 = in_R8B & 1;
  local_2c = in_ECX;
  local_28 = in_EDX;
  uVar3 = workToPhysId((RAAssignment *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                       ,(RegGroup)((uint)in_stack_ffffffffffffffb4 >> 0x18),
                       in_stack_ffffffffffffffb0);
  if (uVar3 != 0xff) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  uVar3 = physToWorkId((RAAssignment *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                       ,(RegGroup)((uint)in_stack_ffffffffffffffac >> 0x18),
                       in_stack_ffffffffffffffa8);
  if (uVar3 != 0xffffffff) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  bVar2 = isPhysAssigned((RAAssignment *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (RegGroup)((uint)in_stack_ffffffffffffffac >> 0x18),
                         in_stack_ffffffffffffffa8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  bVar2 = isPhysDirty((RAAssignment *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (RegGroup)((uint)in_stack_ffffffffffffffac >> 0x18),in_stack_ffffffffffffffa8)
  ;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  in_RDI->_workToPhysMap[local_28].physIds[0] = (uint8_t)local_2c;
  ppuVar4 = Support::Array<unsigned_int_*,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                      ((Array<unsigned_int_*,_4UL> *)CONCAT44(local_28,in_stack_ffffffffffffffb0),
                       (RegGroup *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  (*ppuVar4)[local_2c] = local_28;
  local_18 = &local_2c;
  uVar6 = 1 << ((byte)local_2c & 0x1f);
  uVar7 = uVar6;
  local_8 = local_18;
  puVar5 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                     ((RARegMask *)CONCAT44(local_28,in_stack_ffffffffffffffb0),
                      (RegGroup *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  *puVar5 = uVar7 | *puVar5;
  uVar6 = uVar6 & -(uint)bVar1;
  ctx = local_21;
  local_9 = bVar1;
  puVar5 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                     ((RARegMask *)CONCAT44(local_28,in_stack_ffffffffffffffb0),
                      (RegGroup *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  uVar7 = *puVar5;
  *puVar5 = uVar6 | uVar7;
  verify(in_RDI,ctx,sig,(ulong)(uVar6 | uVar7),(uchar *)CONCAT71(in_register_00000081,in_R8B),in_R9)
  ;
  return;
}

Assistant:

inline void assign(RegGroup group, uint32_t workId, uint32_t physId, bool dirty) noexcept {
    ASMJIT_ASSERT(workToPhysId(group, workId) == kPhysNone);
    ASMJIT_ASSERT(physToWorkId(group, physId) == kWorkNone);
    ASMJIT_ASSERT(!isPhysAssigned(group, physId));
    ASMJIT_ASSERT(!isPhysDirty(group, physId));

    _workToPhysMap->physIds[workId] = uint8_t(physId);
    _physToWorkIds[group][physId] = workId;

    RegMask regMask = Support::bitMask(physId);
    _physToWorkMap->assigned[group] |= regMask;
    _physToWorkMap->dirty[group] |= regMask & Support::bitMaskFromBool<RegMask>(dirty);

    verify();
  }